

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strerror.cc
# Opt level: O0

string * __thiscall
absl::lts_20250127::base_internal::(anonymous_namespace)::StrErrorInternal_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,int errnum)

{
  char **__s;
  allocator<char> local_81;
  char **local_80;
  char *str;
  char buf [100];
  int errnum_local;
  
  buf._92_4_ = SUB84(this,0);
  unique0x100000a2 = __return_storage_ptr__;
  local_80 = (char **)anon_unknown_2::StrErrorAdaptor(buf._92_4_,(char *)&str,100);
  if (*(char *)local_80 == '\0') {
    snprintf((char *)&str,100,"Unknown error %d",(ulong)(uint)buf._92_4_);
    local_80 = &str;
  }
  __s = local_80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)__s,&local_81);
  std::allocator<char>::~allocator(&local_81);
  return __return_storage_ptr__;
}

Assistant:

std::string StrErrorInternal(int errnum) {
  char buf[100];
  const char* str = StrErrorAdaptor(errnum, buf, sizeof buf);
  if (*str == '\0') {
    snprintf(buf, sizeof buf, "Unknown error %d", errnum);
    str = buf;
  }
  return str;
}